

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O1

void __thiscall Alice::ObliviousShuffle(Alice *this)

{
  PermuteProgram(this);
  BlindPermuteProgram(this);
  PermuteData(this);
  BlindPermuteData(this);
  LoadNextRandomPermutation(this);
  LoadNextShuffleVectors(this);
  return;
}

Assistant:

void Alice::ObliviousShuffle()
{
    PermuteProgram();
    BlindPermuteProgram();
    PermuteData();
    BlindPermuteData();
    LoadNextRandomPermutation();
    LoadNextShuffleVectors();
}